

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

index_t __thiscall
GEO::Delaunay3d::locate(Delaunay3d *this,double *p,index_t hint,bool thread_safe,Sign *orient)

{
  uint t;
  pointer piVar1;
  double *pdVar2;
  uint uVar3;
  spinlock sVar4;
  bool bVar5;
  index_t iVar6;
  uint uVar7;
  Sign SVar8;
  long lVar9;
  ulong uVar10;
  Sign *pSVar11;
  undefined7 in_register_00000009;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  double *pv [4];
  Sign orient_local [4];
  double *local_78 [4];
  double *local_58;
  ulong local_50;
  Sign local_48 [6];
  
  local_58 = p;
  iVar6 = locate_inexact(this,p,hint,0x9c4);
  uVar13 = (ulong)iVar6;
  if ((int)CONCAT71(in_register_00000009,thread_safe) != 0) {
    do {
      sVar4 = locate::lock;
      LOCK();
      locate::lock = '\x01';
      UNLOCK();
    } while (sVar4 == '\x01');
  }
  if (iVar6 == 0xffffffff) {
    do {
      lVar9 = random();
      uVar13 = (ulong)(uint)((int)lVar9 +
                            ((int)(SUB168(SEXT816(lVar9) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
                            (SUB164(SEXT816(lVar9) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) *
                            -0x7fffffff) %
               (ulong)((uint)((ulong)((long)(this->cell_to_v_store_).
                                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                            .
                                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->cell_to_v_store_).
                                           super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           .
                                           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) &
                      0x3fffffff);
    } while (-1 < (int)(this->cell_next_).
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       .
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13]);
  }
  bVar5 = tet_is_virtual(this,(index_t)uVar13);
  if (bVar5) {
    uVar10 = (ulong)((index_t)uVar13 * 4);
    lVar9 = 4;
    do {
      if ((this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] == -1) {
        uVar13 = (ulong)(uint)(this->cell_to_cell_store_).
                              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar10];
        break;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pSVar11 = local_48;
  if (orient != (Sign *)0x0) {
    pSVar11 = orient;
  }
  uVar14 = 0xffffffff;
LAB_00153981:
  uVar3 = (uint)uVar13;
  local_50 = (ulong)(uVar3 * 4);
  piVar1 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78[3] = (this->super_Delaunay).vertices_;
  iVar6 = (this->super_Delaunay).vertex_stride_;
  local_78[0] = local_78[3] + piVar1[local_50] * iVar6;
  local_78[1] = local_78[3] + piVar1[local_50 + 1] * iVar6;
  local_78[2] = local_78[3] + piVar1[local_50 + 2] * iVar6;
  local_78[3] = local_78[3] + iVar6 * piVar1[local_50 + 3];
  lVar9 = random();
  iVar12 = 0;
  do {
    uVar7 = (int)lVar9 +
            ((int)(SUB168(SEXT816(lVar9) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
            (SUB164(SEXT816(lVar9) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) * -0x7fffffff +
            iVar12 & 3;
    t = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
        super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 | (uint)local_50];
    uVar13 = (ulong)t;
    if (t == 0xffffffff) {
      if (!thread_safe) {
        return 0xffffffff;
      }
      locate::lock = '\0';
      return 0xffffffff;
    }
    if (t == uVar14) {
      pSVar11[uVar7] = POSITIVE;
    }
    else {
      pdVar2 = local_78[uVar7];
      local_78[uVar7] = local_58;
      SVar8 = PCK::orient_3d(local_78[0],local_78[1],local_78[2],local_78[3]);
      pSVar11[uVar7] = SVar8;
      if (SVar8 == NEGATIVE) break;
      local_78[uVar7] = pdVar2;
    }
    iVar12 = iVar12 + 1;
    if (iVar12 == 4) {
      if (!thread_safe) {
        return uVar3;
      }
      locate::lock = '\0';
      return uVar3;
    }
  } while( true );
  bVar5 = tet_is_virtual(this,t);
  uVar14 = uVar3;
  if (bVar5) {
    if (thread_safe) {
      locate::lock = '\0';
    }
    pSVar11[0] = POSITIVE;
    pSVar11[1] = POSITIVE;
    pSVar11[2] = POSITIVE;
    pSVar11[3] = POSITIVE;
    return t;
  }
  goto LAB_00153981;
}

Assistant:

index_t Delaunay3d::locate(
        const double* p, index_t hint, bool thread_safe,
        Sign* orient
    ) const {

        //   Try improving the hint by using the 
        // inexact locate function. This gains
        // (a little bit) performance (a few 
        // percent in total Delaunay computation
        // time), but it is better than nothing...
        //   Note: there is a maximum number of tets 
        // traversed by locate_inexact()  (2500)
        // since there exists configurations in which
        // locate_inexact() loops forever !
        hint = locate_inexact(p, hint, 2500);

        static Process::spinlock lock = GEOGRAM_SPINLOCK_INIT;

        // We need to have this spinlock because
        // of random() that is not thread-safe
        // (TODO: implement a random() function with
        //  thread local storage)
        if(thread_safe) {
            Process::acquire_spinlock(lock);
        }

        // If no hint specified, find a tetrahedron randomly
        while(hint == NO_TETRAHEDRON) {
            hint = index_t(Numeric::random_int32()) % max_t();
            if(tet_is_free(hint)) {
                hint = NO_TETRAHEDRON;
            }
        }

        //  Always start from a real tet. If the tet is virtual,
        // find its real neighbor (always opposite to the
        // infinite vertex)
        if(tet_is_virtual(hint)) {
            for(index_t lf = 0; lf < 4; ++lf) {
                if(tet_vertex(hint, lf) == VERTEX_AT_INFINITY) {
                    hint = index_t(tet_adjacent(hint, lf));
                    geo_debug_assert(hint != NO_TETRAHEDRON);
                    break;
                }
            }
        }

        index_t t = hint;
        index_t t_pred = NO_TETRAHEDRON;
        Sign orient_local[4];
        if(orient == nullptr) {
            orient = orient_local;
        }


    still_walking:
        {
            const double* pv[4];
            pv[0] = vertex_ptr(finite_tet_vertex(t,0));
            pv[1] = vertex_ptr(finite_tet_vertex(t,1));
            pv[2] = vertex_ptr(finite_tet_vertex(t,2));
            pv[3] = vertex_ptr(finite_tet_vertex(t,3));
            
            // Start from a random facet
            index_t f0 = index_t(Numeric::random_int32()) % 4;
            for(index_t df = 0; df < 4; ++df) {
                index_t f = (f0 + df) % 4;
                
                signed_index_t s_t_next = tet_adjacent(t,f);

                //  If the opposite tet is -1, then it means that
                // we are trying to locate() (e.g. called from
                // nearest_vertex) within a tetrahedralization 
                // from which the infinite tets were removed.
                if(s_t_next == -1) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    return NO_TETRAHEDRON;
                }

                index_t t_next = index_t(s_t_next);

                //   If the candidate next tetrahedron is the
                // one we came from, then we know already that
                // the orientation is positive, thus we examine
                // the next candidate (or exit the loop if they
                // are exhausted).
                if(t_next == t_pred) {
                    orient[f] = POSITIVE ;
                    continue ; 
                }

                //   To test the orientation of p w.r.t. the facet f of
                // t, we replace vertex number f with p in t (same
                // convention as in CGAL).
                // This is equivalent to tet_facet_point_orient3d(t,f,p)
                // (but less costly, saves a couple of lookups)
                const double* pv_bkp = pv[f];
                pv[f] = p;
                orient[f] = PCK::orient_3d(pv[0], pv[1], pv[2], pv[3]);

                //   If the orientation is not negative, then we cannot
                // walk towards t_next, and examine the next candidate
                // (or exit the loop if they are exhausted).
                if(orient[f] != NEGATIVE) {
                    pv[f] = pv_bkp;
                    continue;
                }

                //  If the opposite tet is a virtual tet, then
                // the point has a positive orientation relative
                // to the facet on the border of the convex hull,
                // thus t_next is a tet in conflict and we are
                // done.
                if(tet_is_virtual(t_next)) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    for(index_t lf = 0; lf < 4; ++lf) {
                        orient[lf] = POSITIVE;
                    }
                    return t_next;
                }

                //   If we reach this point, then t_next is a valid
                // successor, thus we are still walking.
                t_pred = t;
                t = t_next;
                goto still_walking;
            }
        } 

        //   If we reach this point, we did not find a valid successor
        // for walking (a face for which p has negative orientation), 
        // thus we reached the tet for which p has all positive 
        // face orientations (i.e. the tet that contains p).

        if(thread_safe) {
            Process::release_spinlock(lock);
        }
        return t;
    }